

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::FileGenerator::Generate(FileGenerator *this,Printer *printer)

{
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
  *this_00;
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>_>
  *this_01;
  bool bVar1;
  int iVar2;
  scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator> *psVar3;
  ExtensionGenerator *pEVar4;
  scoped_ptr<google::protobuf::compiler::java::MessageGenerator> *psVar5;
  MessageGenerator *pMVar6;
  Context *pCVar7;
  GeneratorFactory *pGVar8;
  undefined4 extraout_var;
  ServiceGenerator *pSVar9;
  FileDescriptor *pFVar10;
  int i_2;
  long lVar11;
  int i_1;
  int i;
  long lVar12;
  allocator local_9d;
  int bytecode_estimate;
  scoped_ptr<google::protobuf::compiler::java::Context> *local_98;
  int method_num;
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>_>
  *local_88;
  int static_block_bytecode_estimate;
  
  io::Printer::Print(printer,
                     "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                     ,"filename",*(string **)this->file_);
  if ((this->java_package_)._M_string_length != 0) {
    io::Printer::Print(printer,"package $package$;\n\n","package",&this->java_package_);
  }
  if ((this->options_).annotate_code == true) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &static_block_bytecode_estimate,&this->classname_,".java.pb.meta");
  }
  else {
    std::__cxx11::string::string((string *)&static_block_bytecode_estimate,"",&local_9d);
  }
  PrintGeneratedAnnotation(printer,'$',(string *)&static_block_bytecode_estimate);
  std::__cxx11::string::~string((string *)&static_block_bytecode_estimate);
  io::Printer::Print(printer,"public final class $classname$ {\n  private $ctor$() {}\n","classname"
                     ,&this->classname_,"ctor",&this->classname_);
  io::Printer::Annotate(printer,"classname",*(string **)this->file_);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,
                     "public static void registerAllExtensions(\n    com.google.protobuf.ExtensionRegistryLite registry) {\n"
                    );
  io::Printer::Indent(printer);
  for (lVar12 = 0; pFVar10 = this->file_, lVar12 < *(int *)(pFVar10 + 0x88); lVar12 = lVar12 + 1) {
    psVar3 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>_>
             ::operator[](&this->extension_generators_,lVar12);
    pEVar4 = internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>::operator->
                       (psVar3);
    (*pEVar4->_vptr_ExtensionGenerator[4])(pEVar4,printer);
  }
  this_00 = &this->message_generators_;
  for (lVar12 = 0; lVar12 < *(int *)(pFVar10 + 0x58); lVar12 = lVar12 + 1) {
    psVar5 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
             ::operator[](this_00,lVar12);
    pMVar6 = internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>::operator->
                       (psVar5);
    (*pMVar6->_vptr_MessageGenerator[6])(pMVar6,printer);
    pFVar10 = this->file_;
  }
  local_88 = &this->extension_generators_;
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  pFVar10 = this->file_;
  local_98 = &this->context_;
  pCVar7 = internal::scoped_ptr<google::protobuf::compiler::java::Context>::operator->(local_98);
  if (((pCVar7->options_).enforce_lite == false) &&
     (*(int *)(*(long *)(pFVar10 + 0xa0) + 0xa8) != 3)) {
    io::Printer::Print(printer,
                       "\npublic static void registerAllExtensions(\n    com.google.protobuf.ExtensionRegistry registry) {\n  registerAllExtensions(\n      (com.google.protobuf.ExtensionRegistryLite) registry);\n}\n"
                      );
  }
  pFVar10 = this->file_;
  if (*(char *)(*(long *)(pFVar10 + 0xa0) + 0xa0) == '\0') {
    lVar11 = 0;
    for (lVar12 = 0; lVar12 < *(int *)(pFVar10 + 0x68); lVar12 = lVar12 + 1) {
      pCVar7 = internal::scoped_ptr<google::protobuf::compiler::java::Context>::operator->(local_98)
      ;
      if (((pCVar7->options_).enforce_lite == false) &&
         (*(int *)(*(long *)(pFVar10 + 0xa0) + 0xa8) != 3)) {
        EnumGenerator::EnumGenerator
                  ((EnumGenerator *)&static_block_bytecode_estimate,
                   (EnumDescriptor *)(*(long *)(this->file_ + 0x70) + lVar11),this->immutable_api_,
                   (this->context_).ptr_);
        EnumGenerator::Generate((EnumGenerator *)&static_block_bytecode_estimate,printer);
        EnumGenerator::~EnumGenerator((EnumGenerator *)&static_block_bytecode_estimate);
      }
      else {
        EnumLiteGenerator::EnumLiteGenerator
                  ((EnumLiteGenerator *)&static_block_bytecode_estimate,
                   (EnumDescriptor *)(*(long *)(this->file_ + 0x70) + lVar11),this->immutable_api_,
                   (this->context_).ptr_);
        EnumLiteGenerator::Generate((EnumLiteGenerator *)&static_block_bytecode_estimate,printer);
        EnumLiteGenerator::~EnumLiteGenerator((EnumLiteGenerator *)&static_block_bytecode_estimate);
      }
      pFVar10 = this->file_;
      lVar11 = lVar11 + 0x38;
    }
    for (lVar12 = 0; lVar12 < *(int *)(pFVar10 + 0x58); lVar12 = lVar12 + 1) {
      psVar5 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
               ::operator[](this_00,lVar12);
      pMVar6 = internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>::operator->
                         (psVar5);
      (*pMVar6->_vptr_MessageGenerator[5])(pMVar6,printer);
      psVar5 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
               ::operator[](this_00,lVar12);
      pMVar6 = internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>::operator->
                         (psVar5);
      (*pMVar6->_vptr_MessageGenerator[4])(pMVar6,printer);
      pFVar10 = this->file_;
    }
    pCVar7 = internal::scoped_ptr<google::protobuf::compiler::java::Context>::operator->(local_98);
    bVar1 = HasGenericServices(pFVar10,(pCVar7->options_).enforce_lite);
    if (bVar1) {
      lVar12 = 0;
      for (lVar11 = 0; lVar11 < *(int *)(this->file_ + 0x78); lVar11 = lVar11 + 1) {
        pGVar8 = internal::scoped_ptr<google::protobuf::compiler::java::GeneratorFactory>::
                 operator->(&this->generator_factory_);
        iVar2 = (*pGVar8->_vptr_GeneratorFactory[4])(pGVar8,*(long *)(this->file_ + 0x80) + lVar12);
        _static_block_bytecode_estimate = (pointer)CONCAT44(extraout_var,iVar2);
        pSVar9 = internal::scoped_ptr<google::protobuf::compiler::java::ServiceGenerator>::
                 operator->((scoped_ptr<google::protobuf::compiler::java::ServiceGenerator> *)
                            &static_block_bytecode_estimate);
        (*pSVar9->_vptr_ServiceGenerator[2])(pSVar9,printer);
        if ((long *)_static_block_bytecode_estimate != (long *)0x0) {
          (**(code **)(*(long *)_static_block_bytecode_estimate + 8))();
        }
        lVar12 = lVar12 + 0x30;
      }
    }
  }
  this_01 = local_88;
  for (lVar12 = 0; pFVar10 = this->file_, lVar12 < *(int *)(pFVar10 + 0x88); lVar12 = lVar12 + 1) {
    psVar3 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>_>
             ::operator[](this_01,lVar12);
    pEVar4 = internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>::operator->
                       (psVar3);
    (*pEVar4->_vptr_ExtensionGenerator[2])(pEVar4,printer);
  }
  _static_block_bytecode_estimate = _static_block_bytecode_estimate & 0xffffffff00000000;
  for (lVar12 = 0; lVar12 < *(int *)(pFVar10 + 0x58); lVar12 = lVar12 + 1) {
    psVar5 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
             ::operator[](this_00,lVar12);
    pMVar6 = internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>::operator->
                       (psVar5);
    (*pMVar6->_vptr_MessageGenerator[2])(pMVar6,printer,&static_block_bytecode_estimate);
    pFVar10 = this->file_;
  }
  io::Printer::Print(printer,"\n");
  pFVar10 = this->file_;
  pCVar7 = internal::scoped_ptr<google::protobuf::compiler::java::Context>::operator->(local_98);
  if (((pCVar7->options_).enforce_lite == false) &&
     (*(int *)(*(long *)(pFVar10 + 0xa0) + 0xa8) != 3)) {
    if (this->immutable_api_ == true) {
      GenerateDescriptorInitializationCodeForImmutable(this,printer);
    }
    else {
      GenerateDescriptorInitializationCodeForMutable(this,printer);
    }
  }
  else {
    io::Printer::Print(printer,"static {\n");
    io::Printer::Indent(printer);
    bytecode_estimate = 0;
    method_num = 0;
    for (lVar12 = 0; lVar12 < *(int *)(this->file_ + 0x58); lVar12 = lVar12 + 1) {
      psVar5 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
               ::operator[](this_00,lVar12);
      pMVar6 = internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>::operator->
                         (psVar5);
      iVar2 = (*pMVar6->_vptr_MessageGenerator[3])(pMVar6,printer);
      bytecode_estimate = bytecode_estimate + iVar2;
      anon_unknown_0::MaybeRestartJavaMethod
                (printer,&bytecode_estimate,&method_num,"_clinit_autosplit_$method_num$();\n",
                 "private static void _clinit_autosplit_$method_num$() {\n");
    }
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
  }
  io::Printer::Print(printer,"\n// @@protoc_insertion_point(outer_class_scope)\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void FileGenerator::Generate(io::Printer* printer) {
  // We don't import anything because we refer to all classes by their
  // fully-qualified names in the generated source.
  printer->Print(
    "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "// source: $filename$\n"
    "\n",
    "filename", file_->name());
  if (!java_package_.empty()) {
    printer->Print(
      "package $package$;\n"
      "\n",
      "package", java_package_);
  }
  PrintGeneratedAnnotation(
      printer, '$', options_.annotate_code ? classname_ + ".java.pb.meta" : "");
  printer->Print(
      "public final class $classname$ {\n"
      "  private $ctor$() {}\n",
      "classname", classname_, "ctor", classname_);
  printer->Annotate("classname", file_->name());
  printer->Indent();

  // -----------------------------------------------------------------

  printer->Print(
    "public static void registerAllExtensions(\n"
    "    com.google.protobuf.ExtensionRegistryLite registry) {\n");

  printer->Indent();

  for (int i = 0; i < file_->extension_count(); i++) {
    extension_generators_[i]->GenerateRegistrationCode(printer);
  }

  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateExtensionRegistrationCode(printer);
  }

  printer->Outdent();
  printer->Print(
    "}\n");
  if (HasDescriptorMethods(file_, context_->EnforceLite())) {
    // Overload registerAllExtensions for the non-lite usage to
    // redundantly maintain the original signature (this is
    // redundant because ExtensionRegistryLite now invokes
    // ExtensionRegistry in the non-lite usage). Intent is
    // to remove this in the future.
    printer->Print(
      "\n"
      "public static void registerAllExtensions(\n"
      "    com.google.protobuf.ExtensionRegistry registry) {\n"
      "  registerAllExtensions(\n"
      "      (com.google.protobuf.ExtensionRegistryLite) registry);\n"
      "}\n");
  }

  // -----------------------------------------------------------------

  if (!MultipleJavaFiles(file_, immutable_api_)) {
    for (int i = 0; i < file_->enum_type_count(); i++) {
      if (HasDescriptorMethods(file_, context_->EnforceLite())) {
        EnumGenerator(file_->enum_type(i), immutable_api_, context_.get())
            .Generate(printer);
      } else {
        EnumLiteGenerator(file_->enum_type(i), immutable_api_, context_.get())
            .Generate(printer);
      }
    }
    for (int i = 0; i < file_->message_type_count(); i++) {
      message_generators_[i]->GenerateInterface(printer);
      message_generators_[i]->Generate(printer);
    }
    if (HasGenericServices(file_, context_->EnforceLite())) {
      for (int i = 0; i < file_->service_count(); i++) {
        google::protobuf::scoped_ptr<ServiceGenerator> generator(
            generator_factory_->NewServiceGenerator(file_->service(i)));
        generator->Generate(printer);
      }
    }
  }

  // Extensions must be generated in the outer class since they are values,
  // not classes.
  for (int i = 0; i < file_->extension_count(); i++) {
    extension_generators_[i]->Generate(printer);
  }

  // Static variables. We'd like them to be final if possible, but due to
  // the JVM's 64k size limit on static blocks, we have to initialize some
  // of them in methods; thus they cannot be final.
  int static_block_bytecode_estimate = 0;
  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateStaticVariables(
        printer, &static_block_bytecode_estimate);
  }

  printer->Print("\n");

  if (HasDescriptorMethods(file_, context_->EnforceLite())) {
    if (immutable_api_) {
      GenerateDescriptorInitializationCodeForImmutable(printer);
    } else {
      GenerateDescriptorInitializationCodeForMutable(printer);
    }
  } else {
    printer->Print(
      "static {\n");
    printer->Indent();
    int bytecode_estimate = 0;
    int method_num = 0;

    for (int i = 0; i < file_->message_type_count(); i++) {
      bytecode_estimate += message_generators_[i]->GenerateStaticVariableInitializers(printer);
      MaybeRestartJavaMethod(
        printer,
        &bytecode_estimate, &method_num,
        "_clinit_autosplit_$method_num$();\n",
        "private static void _clinit_autosplit_$method_num$() {\n");
    }

    printer->Outdent();
    printer->Print(
      "}\n");
  }

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(outer_class_scope)\n");

  printer->Outdent();
  printer->Print("}\n");
}